

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_writer.cpp
# Opt level: O3

idx_t duckdb::GetConsecutiveChildList(Vector *list,Vector *result,idx_t offset,idx_t count)

{
  ulong uVar1;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  bool bVar4;
  long *plVar5;
  long lVar6;
  idx_t count_00;
  idx_t iVar7;
  long lVar8;
  sel_t sVar9;
  idx_t c;
  SelectionVector sel;
  SelectionVector local_48;
  
  FlatVector::VerifyFlatVector(list);
  uVar1 = offset + count;
  if (offset < uVar1) {
    pdVar2 = list->data;
    puVar3 = (list->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    plVar5 = (long *)(pdVar2 + offset * 0x10 + 8);
    bVar4 = true;
    count_00 = 0;
    iVar7 = offset;
    do {
      if ((puVar3 == (unsigned_long *)0x0) || ((puVar3[iVar7 >> 6] >> (iVar7 & 0x3f) & 1) != 0)) {
        bVar4 = (bool)(bVar4 & plVar5[-1] == count_00);
        count_00 = count_00 + *plVar5;
      }
      iVar7 = iVar7 + 1;
      plVar5 = plVar5 + 2;
      count = count - 1;
    } while (count != 0);
    if (!bVar4) {
      SelectionVector::SelectionVector(&local_48,count_00);
      if (offset < uVar1) {
        puVar3 = (list->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        lVar6 = 0;
        do {
          if ((puVar3 == (unsigned_long *)0x0) ||
             ((puVar3[offset >> 6] >> (offset & 0x3f) & 1) != 0)) {
            lVar8 = *(long *)(pdVar2 + offset * 0x10 + 8);
            if (lVar8 != 0) {
              sVar9 = *(sel_t *)(pdVar2 + offset * 0x10);
              do {
                local_48.sel_vector[lVar6] = sVar9;
                lVar6 = lVar6 + 1;
                sVar9 = sVar9 + 1;
                lVar8 = lVar8 + -1;
              } while (lVar8 != 0);
            }
          }
          offset = offset + 1;
        } while (offset != uVar1);
      }
      Vector::Slice(result,&local_48,count_00);
      Vector::Flatten(result,count_00);
      if (local_48.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
  }
  else {
    count_00 = 0;
  }
  return count_00;
}

Assistant:

idx_t GetConsecutiveChildList(Vector &list, Vector &result, idx_t offset, idx_t count) {
	// returns a consecutive child list that fully flattens and repeats all required elements
	auto &validity = FlatVector::Validity(list);
	auto list_entries = FlatVector::GetData<list_entry_t>(list);
	bool is_consecutive = true;
	idx_t total_length = 0;
	for (idx_t c = offset; c < offset + count; c++) {
		if (!validity.RowIsValid(c)) {
			continue;
		}
		if (list_entries[c].offset != total_length) {
			is_consecutive = false;
		}
		total_length += list_entries[c].length;
	}
	if (is_consecutive) {
		// already consecutive - leave it as-is
		return total_length;
	}
	SelectionVector sel(total_length);
	idx_t index = 0;
	for (idx_t c = offset; c < offset + count; c++) {
		if (!validity.RowIsValid(c)) {
			continue;
		}
		for (idx_t k = 0; k < list_entries[c].length; k++) {
			sel.set_index(index++, list_entries[c].offset + k);
		}
	}
	result.Slice(sel, total_length);
	result.Flatten(total_length);
	return total_length;
}